

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

ON_Plane * __thiscall
ON_SubDMeshFragment::CornerFrame
          (ON_Plane *__return_storage_ptr__,ON_SubDMeshFragment *this,uint grid_corner_index)

{
  byte bVar1;
  uint *puVar2;
  bool bVar3;
  long lVar4;
  ON_Plane *pOVar5;
  ON_Plane *pOVar6;
  ulong uVar7;
  byte bVar8;
  
  bVar8 = 0;
  if (((grid_corner_index < 4) && (bVar1 = (this->m_grid).m_side_segment_count, bVar1 != 0)) &&
     ((this->m_grid).m_S != (uint *)0x0)) {
    uVar7 = (ulong)(bVar1 * grid_corner_index);
    ON_Plane::ON_Plane(__return_storage_ptr__);
    puVar2 = (this->m_grid).m_S;
    bVar3 = Internal_GetFrameHelper(this,puVar2[uVar7],puVar2[uVar7 + 1],__return_storage_ptr__);
    if (bVar3) {
      return __return_storage_ptr__;
    }
    ON_Plane::~ON_Plane(__return_storage_ptr__);
  }
  pOVar5 = &ON_Plane::NanPlane;
  pOVar6 = __return_storage_ptr__;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pOVar6->origin).x = (pOVar5->origin).x;
    pOVar5 = (ON_Plane *)((long)pOVar5 + ((ulong)bVar8 * -2 + 1) * 8);
    pOVar6 = (ON_Plane *)((long)pOVar6 + (ulong)bVar8 * -0x10 + 8);
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_Plane ON_SubDMeshFragment::CornerFrame(
  unsigned int grid_corner_index
) const
{
  if (grid_corner_index < 4 && m_grid.m_side_segment_count > 0 && nullptr != m_grid.m_S)
  {
    unsigned int S_dex = grid_corner_index * m_grid.m_side_segment_count;
    ON_Plane corner_frame;
    if (Internal_GetFrameHelper(m_grid.m_S[S_dex], m_grid.m_S[S_dex + 1], corner_frame))
      return corner_frame;
  }

  return ON_Plane::NanPlane;
}